

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.cpp
# Opt level: O1

void __thiscall CGraphics_Threaded::QuadsDrawTL(CGraphics_Threaded *this,CQuadItem *pArray,int Num)

{
  CColor *pCVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  long in_FS_OFFSET;
  CPoint CVar9;
  CPoint local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/engine/client/graphics_threaded.cpp"
                 ,0x279,(uint)(this->m_Drawing == 1),"called Graphics()->QuadsDrawTL without begin")
  ;
  if (0 < Num) {
    lVar8 = 0;
    do {
      iVar6 = this->m_NumVertices;
      iVar2 = (int)lVar8;
      iVar7 = iVar2 + iVar6;
      this->m_aVertices[iVar7].m_Pos = *(CPoint *)(&pArray->m_X + lVar8);
      this->m_aVertices[iVar7].m_Tex.i = this->m_aTexture[0].i;
      fVar3 = this->m_aTexture[0].v;
      this->m_aVertices[iVar7].m_Tex.u = this->m_aTexture[0].u;
      this->m_aVertices[iVar7].m_Tex.v = fVar3;
      fVar3 = this->m_aColor[0].g;
      fVar4 = this->m_aColor[0].b;
      fVar5 = this->m_aColor[0].a;
      pCVar1 = &this->m_aVertices[iVar7].m_Color;
      pCVar1->r = this->m_aColor[0].r;
      pCVar1->g = fVar3;
      pCVar1->b = fVar4;
      pCVar1->a = fVar5;
      iVar6 = iVar2 + 1 + iVar6;
      this->m_aVertices[iVar6].m_Pos.x = (&pArray->m_X)[lVar8] + (&pArray->m_Width)[lVar8];
      this->m_aVertices[iVar6].m_Pos.y = (&pArray->m_Y)[lVar8];
      fVar3 = this->m_aTexture[1].v;
      this->m_aVertices[iVar6].m_Tex.u = this->m_aTexture[1].u;
      this->m_aVertices[iVar6].m_Tex.v = fVar3;
      this->m_aVertices[iVar6].m_Tex.i = this->m_aTexture[1].i;
      fVar3 = this->m_aColor[1].g;
      fVar4 = this->m_aColor[1].b;
      fVar5 = this->m_aColor[1].a;
      pCVar1 = &this->m_aVertices[iVar2 + 1 + this->m_NumVertices].m_Color;
      pCVar1->r = this->m_aColor[1].r;
      pCVar1->g = fVar3;
      pCVar1->b = fVar4;
      pCVar1->a = fVar5;
      iVar6 = iVar2 + 2 + this->m_NumVertices;
      CVar9.x = (float)*(undefined8 *)(&pArray->m_Width + lVar8) +
                (float)*(undefined8 *)(&pArray->m_X + lVar8);
      CVar9.y = (float)((ulong)*(undefined8 *)(&pArray->m_Width + lVar8) >> 0x20) +
                (float)((ulong)*(undefined8 *)(&pArray->m_X + lVar8) >> 0x20);
      this->m_aVertices[iVar6].m_Pos = CVar9;
      fVar3 = this->m_aTexture[2].v;
      this->m_aVertices[iVar6].m_Tex.u = this->m_aTexture[2].u;
      this->m_aVertices[iVar6].m_Tex.v = fVar3;
      this->m_aVertices[iVar6].m_Tex.i = this->m_aTexture[2].i;
      fVar3 = this->m_aColor[2].g;
      fVar4 = this->m_aColor[2].b;
      fVar5 = this->m_aColor[2].a;
      pCVar1 = &this->m_aVertices[iVar2 + 2 + this->m_NumVertices].m_Color;
      pCVar1->r = this->m_aColor[2].r;
      pCVar1->g = fVar3;
      pCVar1->b = fVar4;
      pCVar1->a = fVar5;
      iVar6 = iVar2 + 3 + this->m_NumVertices;
      this->m_aVertices[iVar6].m_Pos.x = (&pArray->m_X)[lVar8];
      this->m_aVertices[iVar6].m_Pos.y = (&pArray->m_Y)[lVar8] + (&pArray->m_Height)[lVar8];
      fVar3 = this->m_aTexture[3].v;
      this->m_aVertices[iVar6].m_Tex.u = this->m_aTexture[3].u;
      this->m_aVertices[iVar6].m_Tex.v = fVar3;
      this->m_aVertices[iVar6].m_Tex.i = this->m_aTexture[3].i;
      fVar3 = this->m_aColor[3].g;
      fVar4 = this->m_aColor[3].b;
      fVar5 = this->m_aColor[3].a;
      pCVar1 = &this->m_aVertices[iVar2 + 3 + this->m_NumVertices].m_Color;
      pCVar1->r = this->m_aColor[3].r;
      pCVar1->g = fVar3;
      pCVar1->b = fVar4;
      pCVar1->a = fVar5;
      if ((this->m_Rotation != 0.0) || (NAN(this->m_Rotation))) {
        local_40.x = (float)*(undefined8 *)(&pArray->m_Width + lVar8) * 0.5 +
                     (float)*(undefined8 *)(&pArray->m_X + lVar8);
        local_40.y = (float)((ulong)*(undefined8 *)(&pArray->m_Width + lVar8) >> 0x20) * 0.5 +
                     (float)((ulong)*(undefined8 *)(&pArray->m_X + lVar8) >> 0x20);
        Rotate4(this,&local_40,this->m_aVertices + this->m_NumVertices + lVar8);
      }
      lVar8 = lVar8 + 4;
    } while ((ulong)(uint)Num << 2 != lVar8);
  }
  iVar6 = Num * 4 + this->m_NumVertices;
  this->m_NumVertices = iVar6;
  if (iVar6 + Num * 4 < 0x8000) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    FlushVertices(this);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CGraphics_Threaded::QuadsDrawTL(const CQuadItem *pArray, int Num)
{
	CCommandBuffer::CPoint Center;

	dbg_assert(m_Drawing == DRAWING_QUADS, "called Graphics()->QuadsDrawTL without begin");

	for(int i = 0; i < Num; ++i)
	{
		m_aVertices[m_NumVertices + 4*i].m_Pos.x = pArray[i].m_X;
		m_aVertices[m_NumVertices + 4*i].m_Pos.y = pArray[i].m_Y;
		m_aVertices[m_NumVertices + 4*i].m_Tex = m_aTexture[0];
		m_aVertices[m_NumVertices + 4*i].m_Color = m_aColor[0];

		m_aVertices[m_NumVertices + 4*i + 1].m_Pos.x = pArray[i].m_X + pArray[i].m_Width;
		m_aVertices[m_NumVertices + 4*i + 1].m_Pos.y = pArray[i].m_Y;
		m_aVertices[m_NumVertices + 4*i + 1].m_Tex = m_aTexture[1];
		m_aVertices[m_NumVertices + 4*i + 1].m_Color = m_aColor[1];

		m_aVertices[m_NumVertices + 4*i + 2].m_Pos.x = pArray[i].m_X + pArray[i].m_Width;
		m_aVertices[m_NumVertices + 4*i + 2].m_Pos.y = pArray[i].m_Y + pArray[i].m_Height;
		m_aVertices[m_NumVertices + 4*i + 2].m_Tex = m_aTexture[2];
		m_aVertices[m_NumVertices + 4*i + 2].m_Color = m_aColor[2];

		m_aVertices[m_NumVertices + 4*i + 3].m_Pos.x = pArray[i].m_X;
		m_aVertices[m_NumVertices + 4*i + 3].m_Pos.y = pArray[i].m_Y + pArray[i].m_Height;
		m_aVertices[m_NumVertices + 4*i + 3].m_Tex = m_aTexture[3];
		m_aVertices[m_NumVertices + 4*i + 3].m_Color = m_aColor[3];

		if(m_Rotation != 0)
		{
			Center.x = pArray[i].m_X + pArray[i].m_Width/2;
			Center.y = pArray[i].m_Y + pArray[i].m_Height/2;

			Rotate4(Center, &m_aVertices[m_NumVertices + 4*i]);
		}
	}

	AddVertices(4*Num);
}